

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

pair<bool,_const_char_*> consistentProperty<char_const*>(char *lhs,char *rhs,CompatibleType t)

{
  bool bVar1;
  bool bVar2;
  pair<bool,_const_char_*> pVar3;
  char *local_58;
  char *local_48;
  bool local_39 [8];
  bool same;
  char *null_ptr;
  char *pcStack_28;
  CompatibleType t_local;
  char *rhs_local;
  char *lhs_local;
  char *local_10;
  
  null_ptr._4_4_ = t;
  pcStack_28 = rhs;
  rhs_local = lhs;
  if ((lhs == (char *)0x0) && (rhs == (char *)0x0)) {
    null_ptr._3_1_ = 1;
    pVar3 = std::make_pair<bool,char_const*&>((bool *)((long)&null_ptr + 3),&rhs_local);
    lhs_local._0_1_ = pVar3.first;
  }
  else if (lhs == (char *)0x0) {
    null_ptr._2_1_ = 1;
    pVar3 = std::make_pair<bool,char_const*&>
                      ((bool *)((long)&null_ptr + 2),&stack0xffffffffffffffd8);
    lhs_local._0_1_ = pVar3.first;
  }
  else if (rhs == (char *)0x0) {
    null_ptr._1_1_ = 1;
    pVar3 = std::make_pair<bool,char_const*&>((bool *)((long)&null_ptr + 1),&rhs_local);
    lhs_local._0_1_ = pVar3.first;
  }
  else {
    stack0xffffffffffffffc8 = 0;
    if (t == BoolType) {
      bVar1 = cmSystemTools::IsOn(lhs);
      bVar2 = cmSystemTools::IsOn(pcStack_28);
      local_39[0] = bVar1 == bVar2;
      if (local_39[0]) {
        local_58 = rhs_local;
      }
      else {
        local_58 = (char *)0x0;
      }
      local_48 = local_58;
      pVar3 = std::make_pair<bool&,char_const*>(local_39,&local_48);
      lhs_local._0_1_ = pVar3.first;
    }
    else if (t == StringType) {
      pVar3 = consistentStringProperty(lhs,rhs);
      lhs_local._0_1_ = pVar3.first;
    }
    else {
      if (1 < t - NumberMinType) {
        __assert_fail("false && \"Unreachable!\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                      ,0x1240,
                      "std::pair<bool, const char *> consistentProperty(const char *, const char *, CompatibleType)"
                     );
      }
      pVar3 = consistentNumberProperty(lhs,rhs,t);
      lhs_local._0_1_ = pVar3.first;
    }
  }
  local_10 = pVar3.second;
  pVar3.first = (bool)lhs_local._0_1_;
  pVar3.second = local_10;
  return pVar3;
}

Assistant:

std::pair<bool, const char*> consistentProperty(const char* lhs,
                                                const char* rhs,
                                                CompatibleType t)
{
  if (!lhs && !rhs) {
    return std::make_pair(true, lhs);
  }
  if (!lhs) {
    return std::make_pair(true, rhs);
  }
  if (!rhs) {
    return std::make_pair(true, lhs);
  }

  const char* const null_ptr = nullptr;

  switch (t) {
    case BoolType: {
      bool same = cmSystemTools::IsOn(lhs) == cmSystemTools::IsOn(rhs);
      return std::make_pair(same, same ? lhs : nullptr);
    }
    case StringType:
      return consistentStringProperty(lhs, rhs);
    case NumberMinType:
    case NumberMaxType:
      return consistentNumberProperty(lhs, rhs, t);
  }
  assert(false && "Unreachable!");
  return std::pair<bool, const char*>(false, null_ptr);
}